

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_bucket.cpp
# Opt level: O3

void duckdb::TimeBucketOffsetFunction<duckdb::date_t>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  reference a;
  reference b;
  reference c;
  long lVar1;
  ulong uVar2;
  int iVar3;
  idx_t count;
  code *fun;
  interval_t local_38;
  
  a = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)args,0);
  b = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)args,1);
  c = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)args,2);
  if (*a != (value_type)0x2) {
    TernaryExecutor::
    ExecuteGeneric<duckdb::interval_t,duckdb::date_t,duckdb::interval_t,duckdb::date_t,duckdb::TernaryLambdaWrapper,duckdb::date_t(*)(duckdb::interval_t,duckdb::date_t,duckdb::interval_t)>
              (a,b,c,result,*(idx_t *)(args + 0x18),
               TimeBucket::OffsetTernaryOperator::
               Operation<duckdb::interval_t,duckdb::date_t,duckdb::interval_t,duckdb::date_t>);
    return;
  }
  if ((*(byte **)(a + 0x28) != (byte *)0x0) && ((**(byte **)(a + 0x28) & 1) == 0)) {
    duckdb::Vector::SetVectorType((VectorType)result);
    duckdb::ConstantVector::SetNull(result,true);
    return;
  }
  uVar2 = **(ulong **)(a + 0x20);
  local_38.micros = (*(ulong **)(a + 0x20))[1];
  local_38._0_8_ = uVar2;
  if ((int)uVar2 == 0) {
    lVar1 = duckdb::Interval::GetMicro(&local_38);
    if (0 < lVar1) {
      count = *(idx_t *)(args + 0x18);
      fun = TimeBucket::OffsetWidthConvertibleToMicrosTernaryOperator::
            Operation<duckdb::interval_t,duckdb::date_t,duckdb::interval_t,duckdb::date_t>;
      goto LAB_005adde5;
    }
    uVar2 = local_38._0_8_ & 0xffffffff;
    iVar3 = local_38.days;
  }
  else {
    iVar3 = (int)(uVar2 >> 0x20);
  }
  count = *(idx_t *)(args + 0x18);
  if ((((int)uVar2 < 1) || (iVar3 != 0)) || (local_38.micros != 0)) {
    fun = TimeBucket::OffsetTernaryOperator::
          Operation<duckdb::interval_t,duckdb::date_t,duckdb::interval_t,duckdb::date_t>;
  }
  else {
    fun = TimeBucket::OffsetWidthConvertibleToMonthsTernaryOperator::
          Operation<duckdb::interval_t,duckdb::date_t,duckdb::interval_t,duckdb::date_t>;
  }
LAB_005adde5:
  TernaryExecutor::
  ExecuteGeneric<duckdb::interval_t,duckdb::date_t,duckdb::interval_t,duckdb::date_t,duckdb::TernaryLambdaWrapper,duckdb::date_t(*)(duckdb::interval_t,duckdb::date_t,duckdb::interval_t)>
            (a,b,c,result,count,fun);
  return;
}

Assistant:

static void TimeBucketOffsetFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	D_ASSERT(args.ColumnCount() == 3);

	auto &bucket_width_arg = args.data[0];
	auto &ts_arg = args.data[1];
	auto &offset_arg = args.data[2];

	if (bucket_width_arg.GetVectorType() == VectorType::CONSTANT_VECTOR) {
		if (ConstantVector::IsNull(bucket_width_arg)) {
			result.SetVectorType(VectorType::CONSTANT_VECTOR);
			ConstantVector::SetNull(result, true);
		} else {
			interval_t bucket_width = *ConstantVector::GetData<interval_t>(bucket_width_arg);
			TimeBucket::BucketWidthType bucket_width_type = TimeBucket::ClassifyBucketWidth(bucket_width);
			switch (bucket_width_type) {
			case TimeBucket::BucketWidthType::CONVERTIBLE_TO_MICROS:
				TernaryExecutor::Execute<interval_t, T, interval_t, T>(
				    bucket_width_arg, ts_arg, offset_arg, result, args.size(),
				    TimeBucket::OffsetWidthConvertibleToMicrosTernaryOperator::Operation<interval_t, T, interval_t, T>);
				break;
			case TimeBucket::BucketWidthType::CONVERTIBLE_TO_MONTHS:
				TernaryExecutor::Execute<interval_t, T, interval_t, T>(
				    bucket_width_arg, ts_arg, offset_arg, result, args.size(),
				    TimeBucket::OffsetWidthConvertibleToMonthsTernaryOperator::Operation<interval_t, T, interval_t, T>);
				break;
			case TimeBucket::BucketWidthType::UNCLASSIFIED:
				TernaryExecutor::Execute<interval_t, T, interval_t, T>(
				    bucket_width_arg, ts_arg, offset_arg, result, args.size(),
				    TimeBucket::OffsetTernaryOperator::Operation<interval_t, T, interval_t, T>);
				break;
			default:
				throw NotImplementedException("Bucket type not implemented for TIME_BUCKET");
			}
		}
	} else {
		TernaryExecutor::Execute<interval_t, T, interval_t, T>(
		    bucket_width_arg, ts_arg, offset_arg, result, args.size(),
		    TimeBucket::OffsetTernaryOperator::Operation<interval_t, T, interval_t, T>);
	}
}